

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_constant::translate
          (method_constant *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  value_type ptVar1;
  _Elt_pointer pdVar2;
  const_reference pptVar3;
  statement_constant *this_00;
  _Elt_pointer pptVar4;
  size_t size;
  tree_type<cs::token_base_*> tStack_38;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  size = 1;
  pptVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((raw->
                       super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                       )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar1 = *pptVar3;
  this_00 = (statement_constant *)statement_base::operator_new((statement_base *)0x28,size);
  tree_type<cs::token_base_*>::tree_type(&tStack_38,(tree_type<cs::token_base_*> *)(ptVar1 + 1));
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_30,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  pdVar2 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar4 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar4 ==
      (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar4 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_constant::statement_constant(this_00,&tStack_38,(context_t *)&local_30,pptVar4[-1]);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  tree_type<cs::token_base_*>::~tree_type(&tStack_38);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *
	method_constant::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		return new statement_constant(tree, context, raw.front().back());
	}